

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O2

void __thiscall
CmdLineArgsParser::ParseNumberTrioSet(CmdLineArgsParser *this,NumberTrioSet *numberTrioSet)

{
  uint32 x;
  uint32 y;
  uint32 z;
  
  while( true ) {
    x = ParseInteger(this);
    z = 0xffffffff;
    y = z;
    if (*this->pszCurrentArg == L',') {
      this->pszCurrentArg = this->pszCurrentArg + 1;
      y = ParseInteger(this);
      if (*this->pszCurrentArg == L',') {
        this->pszCurrentArg = this->pszCurrentArg + 1;
        z = ParseInteger(this);
      }
    }
    Js::NumberTrioSet::Add(numberTrioSet,x,y,z);
    if (*this->pszCurrentArg != L';') break;
    this->pszCurrentArg = this->pszCurrentArg + 1;
  }
  return;
}

Assistant:

void
CmdLineArgsParser::ParseNumberTrioSet(Js::NumberTrioSet * numberTrioSet)
{
    while (true)
    {
        int line = ParseInteger();
        int col = -1;
        int stmt = -1;
        if (CurChar() == ',')
        {
            NextChar();
            col = ParseInteger();
        }
        if (CurChar() == ',')
        {
            NextChar();
            stmt = ParseInteger();
        }

        numberTrioSet->Add(line, col, stmt);

        if (CurChar() != ';')
        {
            break;
        }
        NextChar();
    }
}